

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buffer.cpp
# Opt level: O2

value * __thiscall mpt::io::buffer::value(buffer *this)

{
  uint uVar1;
  uchar *__s;
  void *pvVar2;
  size_t sVar3;
  uchar *puVar4;
  value *pvVar5;
  span<const_unsigned_char> sVar6;
  
  pvVar5 = (value *)0x0;
  if (((this->super_encode_array)._state.scratch == 0) &&
     ((this->super_encode_array)._state.done != 0)) {
    sVar6 = encode_array::data(&this->super_encode_array);
    __s = sVar6._base;
    pvVar5 = (value *)0x0;
    pvVar2 = memchr(__s,0,sVar6._len);
    if (pvVar2 != (void *)0x0) {
      sVar3 = (long)pvVar2 + (1 - (long)__s);
      puVar4 = (uchar *)0x0;
      if (-1 < (long)sVar3) {
        puVar4 = __s;
      }
      (this->_record)._base = (char *)puVar4;
      (this->_record)._len = sVar3;
      if ((int)type_properties<mpt::span<char_const>>::id(bool)::_valtype < 1) {
        type_properties<mpt::span<char_const>>::id(bool)::_valtype = 0x43;
      }
      uVar1 = type_properties<mpt::span<char_const>>::id(bool)::_valtype;
      pvVar5 = &this->_value;
      (this->_value)._addr = &this->_record;
      (this->_value)._type = (ulong)uVar1;
    }
  }
  return pvVar5;
}

Assistant:

const struct value *io::buffer::value()
{
	if (_state.scratch || !_state.done) {
		return 0;
	}
	span<const uint8_t> d = data();
	const char *begin = (const char *) d.begin();
	const char *end;
	if (!(end = (char *) memchr(begin, 0, d.size()))) {
		return 0;
	}
	// save current delimited data
	_record = span<const char>(begin, end + 1 - begin);
	_value = _record;
	return &_value;
}